

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

double ON_InternalQuotient(double rel_tol,double numerator,double denominator)

{
  double dVar1;
  double local_50;
  double local_40;
  double s;
  double r;
  double denominator_local;
  double numerator_local;
  double rel_tol_local;
  
  if ((NAN(numerator)) || ((denominator == 0.0 && (!NAN(denominator))))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x55b,"","Invalid input.");
    rel_tol_local = ON_DBL_QNAN;
  }
  else {
    local_50 = ON_InternalDefuzz(rel_tol,numerator / denominator);
    if ((numerator != 0.0) || (NAN(numerator))) {
      local_40 = ON_InternalDefuzz(rel_tol,denominator / numerator);
    }
    else {
      local_40 = 0.0;
    }
    if (2.0 <= local_40) {
      dVar1 = floor(local_40);
      if ((local_40 == dVar1) && (!NAN(local_40) && !NAN(dVar1))) {
        local_50 = 1.0 / local_40;
      }
    }
    rel_tol_local = local_50;
  }
  return rel_tol_local;
}

Assistant:

static double ON_InternalQuotient(
  double rel_tol,
  double numerator,
  double denominator
)
{
  if (numerator == numerator && denominator != 0.0)
  {
    const double r = ON_InternalDefuzz(rel_tol, numerator / denominator);
    const double s = (numerator != 0.0) ? ON_InternalDefuzz(rel_tol, denominator / numerator ) : 0.0;
    return
      (s >= 2.0 && s == floor(s))
      ? (1.0 / s)
      : r;
  }
  ON_ERROR("Invalid input.");
  return ON_DBL_QNAN;
}